

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Turnning.c
# Opt level: O0

double fuseOrientations(double *orientations,double *weights,int size)

{
  double dVar1;
  int local_34;
  int j;
  int num;
  int i;
  double *list;
  int count;
  int size_local;
  double *weights_local;
  double *orientations_local;
  
  list._0_4_ = 0;
  _num = (double *)malloc(8);
  for (j = 0; j < size; j = j + 1) {
    dVar1 = round(weights[j] * 1000.0);
    for (local_34 = 0; local_34 < (int)dVar1; local_34 = local_34 + 1) {
      _num[(int)list] = orientations[j];
      _num = (double *)realloc(_num,(long)((int)list + 2) << 3);
      list._0_4_ = (int)list + 1;
    }
  }
  dVar1 = calculateAngle325(_num,(int)list);
  return dVar1;
}

Assistant:

double fuseOrientations(double orientations[], double weights[],int size){
    int count = 0;
    double* list = (double*)malloc(sizeof(double));
    for (int i = 0; i < size; i++) {
        int num = round(weights[i] * 1000);
        for(int j = 0;j < num;j++){
            list[count++] = orientations[i];
            list = realloc(list, sizeof(double) * (count + 1));
        }
    }
    return calculateAngle325(list,count);
}